

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

uint32_t bits_ask(aec_stream_conflict *strm,int n)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  int iVar3;
  ulong uVar4;
  
  piVar1 = strm->state;
  iVar3 = piVar1->bitp;
  while( true ) {
    if (n <= iVar3) {
      return 1;
    }
    if (strm->avail_in == 0) break;
    strm->avail_in = strm->avail_in - 1;
    uVar4 = piVar1->acc << 8;
    piVar1->acc = uVar4;
    pbVar2 = strm->next_in;
    strm->next_in = pbVar2 + 1;
    piVar1->acc = *pbVar2 | uVar4;
    iVar3 = iVar3 + 8;
    piVar1->bitp = iVar3;
  }
  return 0;
}

Assistant:

static inline uint32_t bits_ask(struct aec_stream *strm, int n)
{
    while (strm->state->bitp < n) {
        if (strm->avail_in == 0)
            return 0;
        strm->avail_in--;
        strm->state->acc <<= 8;
        strm->state->acc |= *strm->next_in++;
        strm->state->bitp += 8;
    }
    return 1;
}